

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

void pack_names(void)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *local_28;
  char *t;
  char *s;
  char *p;
  bucket *bp;
  
  name_pool_size = 0xd;
  for (p = (char *)first_symbol; p != (char *)0x0; p = *(char **)(p + 8)) {
    sVar3 = strlen(*(char **)(p + 0x10));
    name_pool_size = name_pool_size + (int)sVar3 + 1;
  }
  name_pool = (char *)malloc((ulong)(uint)name_pool_size);
  if (name_pool == (char *)0x0) {
    no_space();
  }
  strcpy(name_pool,"$accept");
  strcpy(name_pool + 8,"$end");
  local_28 = name_pool + 0xd;
  for (p = (char *)first_symbol; pcVar2 = local_28, p != (char *)0x0; p = *(char **)(p + 8)) {
    t = *(char **)(p + 0x10);
    do {
      cVar1 = *t;
      pcVar4 = local_28 + 1;
      *local_28 = cVar1;
      local_28 = pcVar4;
      t = t + 1;
    } while (cVar1 != '\0');
    free(*(void **)(p + 0x10));
    *(char **)(p + 0x10) = pcVar2;
  }
  return;
}

Assistant:

void pack_names()
{
    register bucket *bp;
    register char *p, *s, *t;

    name_pool_size = 13;  /* 13 == sizeof("$end") + sizeof("$accept") */
    for (bp = first_symbol; bp; bp = bp->next)
	name_pool_size += strlen(bp->name) + 1;
    name_pool = MALLOC(name_pool_size);
    if (name_pool == 0) no_space();

    strcpy(name_pool, "$accept");
    strcpy(name_pool+8, "$end");
    t = name_pool + 13;
    for (bp = first_symbol; bp; bp = bp->next) {
	p = t;
	s = bp->name;
	while ((*t++ = *s++)) continue;
	FREE(bp->name);
	bp->name = p; }
}